

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# initiate_post.hpp
# Opt level: O0

void __thiscall
asio::detail::initiate_post_with_executor<asio::any_io_executor>::operator()
          (initiate_post_with_executor<asio::any_io_executor> *this,
          binder1<std::function<void_(const_std::error_code_&)>,_std::error_code> *handler,
          enable_if_t<execution::is_executor<conditional_t<true,_executor_type,_binder1<function<void_(const_error_code_&)>,_error_code>_>_>::value>
          *param_3,enable_if_t<_detail::is_work_dispatcher_required<decay_t<binder1<function<void_(const_error_code_&)>,_error_code>_>,_any_io_executor>::value>
                   *param_4)

{
  binder1<std::function<void_(const_std::error_code_&)>,_std::error_code> *in_RDI;
  associated_allocator_t<decay_t<binder1<function<void_(const_error_code_&)>,_error_code>_>_> alloc;
  binder1<std::function<void_(const_std::error_code_&)>,_std::error_code> *in_stack_ffffffffffffff20
  ;
  impl *in_stack_ffffffffffffff28;
  allocator_t<std::allocator<void>_> *in_stack_ffffffffffffff60;
  fork_t<0> *in_stack_ffffffffffffff68;
  any_io_executor *in_stack_ffffffffffffff70;
  impl *in_stack_ffffffffffffff78;
  binder0<asio::detail::binder1<std::function<void_(const_std::error_code_&)>,_std::error_code>_>
  *in_stack_ffffffffffffffa8;
  any_executor_base *in_stack_ffffffffffffffb0;
  
  get_associated_allocator<asio::detail::binder1<std::function<void(std::error_code_const&)>,std::error_code>>
            (in_stack_ffffffffffffff20);
  asio_require_fn::impl::operator()
            (in_stack_ffffffffffffff28,(any_io_executor *)in_stack_ffffffffffffff20,
             (never_t<0> *)in_RDI);
  execution::allocator_t<void>::operator()((allocator_t<void> *)in_RDI,(allocator<void> *)0x6fec60);
  asio_prefer_fn::impl::operator()
            (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
             in_stack_ffffffffffffff60);
  bind_handler<asio::detail::binder1<std::function<void(std::error_code_const&)>,std::error_code>>
            (in_RDI);
  execution::detail::any_executor_base::
  execute<asio::detail::binder0<asio::detail::binder1<std::function<void(std::error_code_const&)>,std::error_code>>>
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  binder0<asio::detail::binder1<std::function<void_(const_std::error_code_&)>,_std::error_code>_>::
  ~binder0((binder0<asio::detail::binder1<std::function<void_(const_std::error_code_&)>,_std::error_code>_>
            *)0x6fecbb);
  any_io_executor::~any_io_executor((any_io_executor *)0x6fecc8);
  any_io_executor::~any_io_executor((any_io_executor *)0x6fecd2);
  return;
}

Assistant:

void operator()(CompletionHandler&& handler,
      enable_if_t<
        execution::is_executor<
          conditional_t<true, executor_type, CompletionHandler>
        >::value
      >* = 0,
      enable_if_t<
        !detail::is_work_dispatcher_required<
          decay_t<CompletionHandler>,
          Executor
        >::value
      >* = 0) const
  {
    associated_allocator_t<decay_t<CompletionHandler>> alloc(
        (get_associated_allocator)(handler));

    asio::prefer(
        asio::require(ex_, execution::blocking.never),
        execution::relationship.fork,
        execution::allocator(alloc)
      ).execute(
        asio::detail::bind_handler(
          static_cast<CompletionHandler&&>(handler)));
  }